

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *s,QRegion *r)

{
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char *)0x0;
  local_38.d.size = 0;
  operator>>(s,&local_38);
  QRegion::exec(r,&local_38,*(int *)(s + 0x18),(uint)(byte)s[0x11]);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QRegion &r)
{
    QByteArray b;
    s >> b;
    r.exec(b, s.version(), s.byteOrder());
    return s;
}